

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

void __thiscall xemmai::t_engine::f_tick(t_engine *this)

{
  t_engine tVar1;
  t_engine *this_local;
  __atomic_flag_data_type __v;
  
  if (((byte)*this & 1) == 0) {
    LOCK();
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    UNLOCK();
    LOCK();
    tVar1 = *this;
    *this = (t_engine)0x1;
    UNLOCK();
    if (tVar1 == (t_engine)0x0) {
      std::__atomic_notify_address<bool>((bool *)this,false);
    }
  }
  return;
}

Assistant:

void f_tick()
	{
		if (v_collector__running.test(std::memory_order_relaxed)) return;
		v_collector__tick.fetch_add(1, std::memory_order_relaxed);
		if (!v_collector__running.test_and_set(std::memory_order_release)) v_collector__running.notify_one();
	}